

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::Functional::anon_unknown_0::ScissorClearCase::render
          (ScissorClearCase *this,GLuint program,IVec4 *param_2)

{
  glUniform4fvFunc p_Var1;
  int iVar2;
  GLint GVar3;
  undefined4 extraout_var;
  Vec4 white;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  float local_30;
  Vec3 local_2c;
  Functions *gl;
  
  iVar2 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  local_48 = &DAT_3f8000003f800000;
  puStack_40 = &DAT_3f8000003f800000;
  (*gl->clearColor)(0.6,0.1,0.1,1.0);
  (*gl->clearDepthf)(0.0);
  if ((this->m_clearMode & 0x100) != 0) {
    (*gl->enable)(0xb71);
    (*gl->depthFunc)(0x204);
  }
  if ((this->m_clearMode & 0x400) != 0) {
    (*gl->clearStencil)(0x7b);
    (*gl->enable)(0xb90);
    (*gl->stencilFunc)(0x202,0x7b,0xffffffff);
  }
  if ((this->m_clearMode & 0x4000) != 0) {
    (*gl->clearColor)(0.1,0.6,0.1,1.0);
  }
  (*gl->clear)(this->m_clearMode);
  (*gl->disable)(0xc11);
  p_Var1 = gl->uniform4fv;
  GVar3 = (*gl->getUniformLocation)(program,"u_color");
  (*p_Var1)(GVar3,1,(GLfloat *)&local_48);
  if ((this->m_clearMode & 0x4000) == 0) {
    local_2c.m_data[0] = -1.0;
    local_2c.m_data[1] = -1.0;
    local_2c.m_data[2] = 0.5;
    local_38 = &DAT_3f8000003f800000;
    local_30 = 0.5;
    drawQuad(gl,program,&local_2c,(Vec3 *)&local_38);
  }
  (*gl->disable)(0xb71);
  (*gl->disable)(0xb90);
  return;
}

Assistant:

void ScissorClearCase::render (GLuint program, const IVec4&) const
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	const Vec4				white	(1.0f, 1.0f, 1.0f, 1.0);

	gl.clearColor(0.6f, 0.1f, 0.1f, 1.0);
	gl.clearDepthf(0.0f);

	if (m_clearMode & GL_DEPTH_BUFFER_BIT)
	{
		gl.enable(GL_DEPTH_TEST);
		gl.depthFunc(GL_GREATER);
	}

	if (m_clearMode & GL_STENCIL_BUFFER_BIT)
	{
		gl.clearStencil(123);
		gl.enable(GL_STENCIL_TEST);
		gl.stencilFunc(GL_EQUAL, 123, ~0u);
	}

	if (m_clearMode & GL_COLOR_BUFFER_BIT)
		gl.clearColor(0.1f, 0.6f, 0.1f, 1.0);

	gl.clear(m_clearMode);
	gl.disable(GL_SCISSOR_TEST);

	gl.uniform4fv(gl.getUniformLocation(program, "u_color"), 1, white.getPtr());

	if (!(m_clearMode & GL_COLOR_BUFFER_BIT))
		drawQuad(gl, program, Vec3(-1.0f, -1.0f, 0.5f), Vec3(1.0f, 1.0f, 0.5f));

	gl.disable(GL_DEPTH_TEST);
	gl.disable(GL_STENCIL_TEST);
}